

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_block_mpi_grow(BigBlock *bb,int Nfile_grow,size_t *fsize_grow,MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  FILE *__stream;
  ulong uVar3;
  MPI_Comm extraout_RDX;
  MPI_Comm extraout_RDX_00;
  MPI_Comm comm_00;
  ulong uVar4;
  ulong uVar5;
  int rank;
  int NTask;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    iVar2 = 0;
  }
  else {
    _rank = in_RAX;
    MPI_Comm_size(comm,&NTask);
    MPI_Comm_rank(comm,&rank);
    iVar1 = bb->Nfile;
    iVar2 = 0;
    if (rank == 0) {
      iVar2 = _big_block_grow_internal(bb,Nfile_grow,fsize_grow);
    }
    iVar2 = big_file_mpi_broadcast_anyerror(iVar2,comm);
    if (iVar2 == 0) {
      comm_00 = extraout_RDX;
      if (rank != 0) {
        _big_block_close_internal(bb);
        comm_00 = extraout_RDX_00;
      }
      big_block_mpi_broadcast(bb,(int)comm,comm_00);
      uVar3 = (ulong)rank;
      uVar4 = (ulong)NTask;
      for (uVar5 = (ulong)(int)((uVar3 * (long)Nfile_grow) / uVar4);
          uVar5 < (ulong)((long)((int)uVar3 + 1) * (long)Nfile_grow) / (ulong)(long)(int)uVar4;
          uVar5 = uVar5 + 1) {
        __stream = (FILE *)_big_file_open_a_file(bb->basename,(int)uVar5 + iVar1,"w",1);
        if (__stream == (FILE *)0x0) {
          iVar2 = -1;
          goto LAB_0010486c;
        }
        fclose(__stream);
        uVar3 = _rank & 0xffffffff;
        uVar4 = _rank >> 0x20;
      }
      iVar2 = 0;
LAB_0010486c:
      iVar2 = big_file_mpi_broadcast_anyerror(iVar2,comm);
    }
  }
  return iVar2;
}

Assistant:

int
big_block_mpi_grow(BigBlock * bb,
    int Nfile_grow,
    const size_t fsize_grow[],
    MPI_Comm comm) {

    int rank;
    int NTask;
    int rt;

    if(comm == MPI_COMM_NULL) return 0;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &rank);

    int oldNfile = bb->Nfile;

    if(rank == 0) {
        rt = _big_block_grow_internal(bb, Nfile_grow, fsize_grow);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    if(rank != 0) {
        /* closed on non-root because we will bcast.*/
        _big_block_close_internal(bb);
    }
    big_block_mpi_broadcast(bb, 0, comm);

    int i;
    for(i = (size_t) Nfile_grow * rank / NTask; i < (size_t) Nfile_grow * (rank + 1) / NTask; i ++) {
        FILE * fp = _big_file_open_a_file(bb->basename, i + oldNfile, "w", 1);
        if(fp == NULL) {
            rt = -1;
            break;
        }
        fclose(fp);
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}